

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compilation.cpp
# Opt level: O3

void __thiscall
slang::ast::Compilation::parseParamOverrides
          (Compilation *this,flat_hash_map<std::string_view,_const_ConstantValue_*> *results)

{
  undefined1 *puVar1;
  long lVar2;
  group_type_pointer pgVar3;
  table_arrays<std::pair<const_std::type_index,_std::any>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_std::type_index,_std::any>_>_>
  *ptVar4;
  ScriptSession *__n;
  group_type_pointer pgVar5;
  value_type_pointer ppVar6;
  uint uVar7;
  uchar uVar8;
  uchar uVar9;
  uchar uVar10;
  byte bVar11;
  bool bVar12;
  byte bVar13;
  uint uVar14;
  void *pvVar15;
  NameSyntax *pNVar16;
  Diagnostic *this_00;
  uint64_t hash;
  table_arrays<std::pair<const_std::type_index,_std::any>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_std::type_index,_std::any>_>_>
  *ptVar17;
  ScriptSession *pSVar18;
  table_arrays<std::pair<const_std::type_index,_std::any>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_std::type_index,_std::any>_>_>
  *ptVar19;
  char *pcVar20;
  ulong uVar21;
  char *pcVar22;
  ulong pos0;
  table_arrays<std::pair<const_std::type_index,_std::any>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_std::type_index,_std::any>_>_>
  *arg;
  undefined1 auVar23 [16];
  string_view name_00;
  string_view text;
  try_emplace_args_t local_1249;
  table_arrays<std::pair<const_std::type_index,_std::any>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_std::type_index,_std::any>_>_>
  *local_1248;
  ConstantValue *local_1240;
  string_view name;
  ConstantValue cv;
  locator res;
  table_arrays<std::pair<const_std::type_index,_std::any>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_std::type_index,_std::any>_>_>
  arrays;
  Diagnostics localDiags;
  ScriptSession session;
  ScriptSession *this_01;
  
  if ((this->options).paramOverrides.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (this->options).paramOverrides.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    ptVar19 = &arrays;
    arrays.groups_size_index = 0x3f;
    arrays.groups_size_mask = 1;
    arrays.elements_ = (value_type_pointer)0x0;
    arrays.groups_ =
         (group_type_pointer)
         boost::unordered::detail::foa::
         dummy_groups<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,2ul>()
         ::storage;
    local_1248 = (table_arrays<std::pair<const_std::type_index,_std::any>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_std::type_index,_std::any>_>_>
                  *)results;
    ScriptSession::ScriptSession(&session,(Bag *)ptVar19);
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<std::type_index,_std::any>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::type_index,_void>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::any>_>_>
    ::~table_core((table_core<boost::unordered::detail::foa::flat_map_types<std::type_index,_std::any>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::type_index,_void>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::any>_>_>
                   *)&arrays);
    arg = (table_arrays<std::pair<const_std::type_index,_std::any>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_std::type_index,_std::any>_>_>
           *)(this->options).paramOverrides.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    ptVar4 = (table_arrays<std::pair<const_std::type_index,_std::any>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_std::type_index,_std::any>_>_>
              *)(this->options).paramOverrides.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    if (arg != ptVar4) {
      do {
        __n = (ScriptSession *)arg->groups_size_mask;
        if (__n == (ScriptSession *)0x0) {
LAB_002dccc6:
          this_00 = Scope::addDiag(&((this->root)._M_t.
                                     super___uniq_ptr_impl<slang::ast::RootSymbol,_std::default_delete<slang::ast::RootSymbol>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_slang::ast::RootSymbol_*,_std::default_delete<slang::ast::RootSymbol>_>
                                     .super__Head_base<0UL,_slang::ast::RootSymbol_*,_false>.
                                    _M_head_impl)->super_Scope,(DiagCode)0xf000d,
                                   (SourceLocation)0xffffffffffffffff);
          ptVar19 = arg;
          Diagnostic::operator<<(this_00,(string *)arg);
        }
        else {
          pcVar22 = (char *)arg->groups_size_index;
          pvVar15 = memchr(pcVar22,0x3d,(size_t)__n);
          pSVar18 = (ScriptSession *)((long)pvVar15 - (long)pcVar22);
          if (pSVar18 == (ScriptSession *)0xffffffffffffffff || pvVar15 == (void *)0x0)
          goto LAB_002dccc6;
          localDiags.super_SmallVector<slang::Diagnostic,_2UL>.
          super_SmallVectorBase<slang::Diagnostic>.data_ =
               (pointer)localDiags.super_SmallVector<slang::Diagnostic,_2UL>.
                        super_SmallVectorBase<slang::Diagnostic>.firstElement;
          localDiags.super_SmallVector<slang::Diagnostic,_2UL>.
          super_SmallVectorBase<slang::Diagnostic>.len = 0;
          localDiags.super_SmallVector<slang::Diagnostic,_2UL>.
          super_SmallVectorBase<slang::Diagnostic>.cap = 2;
          this_01 = pSVar18;
          if (__n < pSVar18) {
            this_01 = __n;
          }
          name_00._M_str = pcVar22;
          name_00._M_len = (size_t)this_01;
          name._M_len = (size_t)this_01;
          name._M_str = pcVar22;
          pNVar16 = tryParseName(this,name_00,&localDiags);
          if (((pNVar16->super_ExpressionSyntax).super_SyntaxNode.kind != IdentifierName) ||
             (localDiags.super_SmallVector<slang::Diagnostic,_2UL>.
              super_SmallVectorBase<slang::Diagnostic>.len != 0)) {
LAB_002dccb9:
            SmallVectorBase<slang::Diagnostic>::cleanup
                      ((SmallVectorBase<slang::Diagnostic> *)&localDiags,(EVP_PKEY_CTX *)this_01);
            goto LAB_002dccc6;
          }
          puVar1 = (undefined1 *)
                   ((long)&(pSVar18->options).items.table_.
                           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::type_index,_std::any>,_slang::hash<std::type_index>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::any>_>_>
                           .arrays.groups_size_index + 1);
          if (__n <= pSVar18) {
            std::__throw_out_of_range_fmt
                      ("%s: __pos (which is %zu) > __size (which is %zu)",
                       "basic_string_view::substr",puVar1,__n);
          }
          this_01 = &session;
          text._M_str = pcVar22 + (long)puVar1;
          text._M_len = (long)__n - (long)puVar1;
          ScriptSession::eval(&cv,this_01,text);
          if (cv.value.
              super__Variant_base<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
              .
              super__Move_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
              .
              super__Copy_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
              .
              super__Move_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
              .
              super__Copy_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
              .
              super__Variant_storage_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
              ._M_index == '\0') {
            std::__detail::__variant::
            _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
            ::~_Variant_storage((_Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                                 *)&cv);
            goto LAB_002dccb9;
          }
          local_1240 = TypedBumpAllocator<slang::ConstantValue>::emplace<slang::ConstantValue>
                                 (&this->constantAllocator,&cv);
          ptVar17 = local_1248;
          hash = hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::operator()
                           ((hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)
                            local_1248,&name);
          pos0 = hash >> ((byte)ptVar17->groups_size_index & 0x3f);
          lVar2 = (hash & 0xff) * 4;
          uVar8 = (&UNK_004a938c)[lVar2];
          uVar9 = (&UNK_004a938d)[lVar2];
          uVar10 = (&UNK_004a938e)[lVar2];
          bVar11 = (&UNK_004a938f)[lVar2];
          pcVar22 = (char *)0x0;
          uVar21 = pos0;
          do {
            pgVar5 = ptVar17->groups_;
            pgVar3 = pgVar5 + uVar21;
            bVar13 = pgVar3->m[0xf].n;
            auVar23[0] = -(pgVar3->m[0].n == uVar8);
            auVar23[1] = -(pgVar3->m[1].n == uVar9);
            auVar23[2] = -(pgVar3->m[2].n == uVar10);
            auVar23[3] = -(pgVar3->m[3].n == bVar11);
            auVar23[4] = -(pgVar3->m[4].n == uVar8);
            auVar23[5] = -(pgVar3->m[5].n == uVar9);
            auVar23[6] = -(pgVar3->m[6].n == uVar10);
            auVar23[7] = -(pgVar3->m[7].n == bVar11);
            auVar23[8] = -(pgVar3->m[8].n == uVar8);
            auVar23[9] = -(pgVar3->m[9].n == uVar9);
            auVar23[10] = -(pgVar3->m[10].n == uVar10);
            auVar23[0xb] = -(pgVar3->m[0xb].n == bVar11);
            auVar23[0xc] = -(pgVar3->m[0xc].n == uVar8);
            auVar23[0xd] = -(pgVar3->m[0xd].n == uVar9);
            auVar23[0xe] = -(pgVar3->m[0xe].n == uVar10);
            auVar23[0xf] = -(bVar13 == bVar11);
            uVar14 = (uint)(ushort)((ushort)(SUB161(auVar23 >> 7,0) & 1) |
                                    (ushort)(SUB161(auVar23 >> 0xf,0) & 1) << 1 |
                                    (ushort)(SUB161(auVar23 >> 0x17,0) & 1) << 2 |
                                    (ushort)(SUB161(auVar23 >> 0x1f,0) & 1) << 3 |
                                    (ushort)(SUB161(auVar23 >> 0x27,0) & 1) << 4 |
                                    (ushort)(SUB161(auVar23 >> 0x2f,0) & 1) << 5 |
                                    (ushort)(SUB161(auVar23 >> 0x37,0) & 1) << 6 |
                                    (ushort)(SUB161(auVar23 >> 0x3f,0) & 1) << 7 |
                                    (ushort)(SUB161(auVar23 >> 0x47,0) & 1) << 8 |
                                    (ushort)(SUB161(auVar23 >> 0x4f,0) & 1) << 9 |
                                    (ushort)(SUB161(auVar23 >> 0x57,0) & 1) << 10 |
                                    (ushort)(SUB161(auVar23 >> 0x5f,0) & 1) << 0xb |
                                    (ushort)(SUB161(auVar23 >> 0x67,0) & 1) << 0xc |
                                    (ushort)(SUB161(auVar23 >> 0x6f,0) & 1) << 0xd |
                                   (ushort)(SUB161(auVar23 >> 0x77,0) & 1) << 0xe);
            if (uVar14 != 0) {
              ppVar6 = ptVar17->elements_;
              do {
                uVar7 = 0;
                if (uVar14 != 0) {
                  for (; (uVar14 >> uVar7 & 1) == 0; uVar7 = uVar7 + 1) {
                  }
                }
                ptVar19 = (table_arrays<std::pair<const_std::type_index,_std::any>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_std::type_index,_std::any>_>_>
                           *)&name;
                bVar12 = std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>::
                         operator()((equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>
                                     *)ptVar17,
                                    (basic_string_view<char,_std::char_traits<char>_> *)ptVar19,
                                    (basic_string_view<char,_std::char_traits<char>_> *)
                                    (ppVar6 + uVar21 * 0xf + (ulong)uVar7));
                if (bVar12) goto LAB_002dce92;
                uVar14 = uVar14 - 1 & uVar14;
                ptVar17 = local_1248;
              } while (uVar14 != 0);
              bVar13 = pgVar5[uVar21].m[0xf].n;
            }
            ptVar17 = local_1248;
            if (((&boost::unordered::detail::foa::
                   group15<boost::unordered::detail::foa::plain_integral>::
                   is_not_overflowed(unsigned_long)::shift)[(uint)hash & 7] & bVar13) == 0) break;
            pcVar20 = pcVar22 + uVar21 + 1;
            pcVar22 = pcVar22 + 1;
            uVar21 = (ulong)pcVar20 & (ulong)local_1248->groups_size_mask;
          } while (pcVar22 <= (char *)local_1248->groups_size_mask);
          ptVar19 = local_1248;
          if ((char *)local_1248[1].groups_size_mask < (char *)local_1248[1].groups_size_index) {
            boost::unordered::detail::foa::
            table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ConstantValue_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ConstantValue_const*>>>
            ::
            nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>&,slang::ConstantValue*>
                      (&res,(table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ConstantValue_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ConstantValue_const*>>>
                             *)local_1248,(arrays_type *)local_1248,pos0,hash,&local_1249,&name,
                       &local_1240);
            ptVar17[1].groups_size_mask = (size_t)((char *)ptVar17[1].groups_size_mask + 1);
          }
          else {
            boost::unordered::detail::foa::
            table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ConstantValue_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ConstantValue_const*>>>
            ::
            unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>&,slang::ConstantValue*>
                      (&res,(table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ConstantValue_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ConstantValue_const*>>>
                             *)local_1248,hash,&local_1249,&name,&local_1240);
          }
LAB_002dce92:
          std::__detail::__variant::
          _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
          ::~_Variant_storage((_Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                               *)&cv);
          SmallVectorBase<slang::Diagnostic>::cleanup
                    ((SmallVectorBase<slang::Diagnostic> *)&localDiags,(EVP_PKEY_CTX *)ptVar19);
        }
        arg = arg + 1;
      } while (arg != ptVar4);
    }
    SmallVectorBase<slang::Diagnostic>::cleanup
              ((SmallVectorBase<slang::Diagnostic> *)&session.evalContext.warnings,
               (EVP_PKEY_CTX *)ptVar19);
    SmallVectorBase<slang::Diagnostic>::cleanup
              ((SmallVectorBase<slang::Diagnostic> *)&session.evalContext.diags,
               (EVP_PKEY_CTX *)ptVar19);
    if (session.evalContext.lvalStack.super_SmallVectorBase<slang::ast::LValue_*>.data_ !=
        (pointer)session.evalContext.lvalStack.super_SmallVectorBase<slang::ast::LValue_*>.
                 firstElement) {
      operator_delete(session.evalContext.lvalStack.super_SmallVectorBase<slang::ast::LValue_*>.
                      data_);
    }
    SmallVectorBase<slang::ast::EvalContext::Frame>::cleanup
              (&session.evalContext.stack.super_SmallVectorBase<slang::ast::EvalContext::Frame>,
               (EVP_PKEY_CTX *)ptVar19);
    std::
    vector<std::shared_ptr<slang::syntax::SyntaxTree>,_std::allocator<std::shared_ptr<slang::syntax::SyntaxTree>_>_>
    ::~vector(&session.syntaxTrees);
    ~Compilation(&session.compilation);
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<std::type_index,_std::any>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::type_index,_void>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::any>_>_>
    ::~table_core((table_core<boost::unordered::detail::foa::flat_map_types<std::type_index,_std::any>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::type_index,_void>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::any>_>_>
                   *)&session);
  }
  return;
}

Assistant:

void Compilation::addGateType(const PrimitiveSymbol& prim) {
    SLANG_ASSERT(!isFrozen());
    SLANG_ASSERT(!prim.name.empty());
    gateMap.emplace(prim.name, &prim);
}